

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t2.c
# Opt level: O0

int t2_decode_packet(opj_t2_t *t2,uchar *src,int len,opj_tcd_tile_t *tile,opj_tcp_t *tcp,
                    opj_pi_iterator_t *pi,opj_packet_info_t *pack_info)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  OPJ_UINT32 OVar5;
  long lVar6;
  int *piVar7;
  long lVar8;
  opj_bio_t *bio_00;
  long lVar9;
  long lVar10;
  long *plVar11;
  undefined8 *puVar12;
  void *pvVar13;
  long in_RCX;
  int in_EDX;
  uchar *in_RSI;
  undefined8 *in_RDI;
  long in_R8;
  long in_R9;
  long in_stack_00000008;
  opj_tcd_seg_t *seg;
  opj_tcd_cblk_dec_t *cblk_2;
  opj_tcd_precinct_t *prc_2;
  opj_tcd_band_t *band_2;
  int numimsbs;
  int i;
  opj_tcd_cblk_dec_t *cblk_1;
  int segno;
  int n;
  int increment;
  int included;
  opj_tcd_precinct_t *prc_1;
  opj_tcd_band_t *band_1;
  opj_tcd_cblk_dec_t *cblk;
  opj_tcd_precinct_t *prc;
  opj_tcd_band_t *band;
  opj_bio_t *bio;
  int present;
  uchar *hd;
  opj_tcd_resolution_t *res;
  int layno;
  int precno;
  int resno;
  int compno;
  opj_cp_t *cp;
  uchar *c;
  int cblkno;
  int bandno;
  undefined4 in_stack_ffffffffffffff08;
  int in_stack_ffffffffffffff0c;
  opj_bio_t *in_stack_ffffffffffffff10;
  undefined8 in_stack_ffffffffffffff18;
  int index;
  opj_tcd_cblk_dec_t *in_stack_ffffffffffffff20;
  int local_c4;
  int local_b8;
  int local_b4;
  OPJ_UINT32 local_ac;
  uchar *local_70;
  uchar *local_48;
  int local_40;
  int local_3c;
  int local_4;
  
  lVar10 = in_RDI[2];
  iVar4 = *(int *)(in_R9 + 0x28);
  lVar6 = *(long *)(*(long *)(in_RCX + 0x18) + (long)*(int *)(in_R9 + 0x20) * 0x30 + 0x18) +
          (long)*(int *)(in_R9 + 0x24) * 0x98;
  if (*(int *)(in_R9 + 0x2c) == 0) {
    for (local_3c = 0; local_3c < *(int *)(lVar6 + 0x18); local_3c = local_3c + 1) {
      piVar7 = (int *)(lVar6 + 0x20 + (long)local_3c * 0x28);
      lVar8 = *(long *)(piVar7 + 6) + (long)iVar4 * 0x30;
      if ((piVar7[2] != *piVar7) && (piVar7[3] != piVar7[1])) {
        tgt_reset(*(opj_tgt_tree_t **)(lVar8 + 0x20));
        tgt_reset(*(opj_tgt_tree_t **)(lVar8 + 0x28));
        for (local_40 = 0; local_40 < *(int *)(lVar8 + 0x10) * *(int *)(lVar8 + 0x14);
            local_40 = local_40 + 1) {
          *(undefined4 *)(*(long *)(lVar8 + 0x18) + (long)local_40 * 0x38 + 0x30) = 0;
        }
      }
    }
  }
  local_48 = in_RSI;
  if ((*(uint *)(in_R8 + 4) & 2) != 0) {
    if ((*in_RSI == 0xff) && (in_RSI[1] == 0x91)) {
      local_48 = in_RSI + 6;
    }
    else {
      opj_event_msg((opj_common_ptr)*in_RDI,2,"Expected SOP marker\n");
    }
  }
  bio_00 = bio_create();
  iVar2 = (int)in_RSI;
  local_4 = (int)local_48;
  if (*(int *)(lVar10 + 0x70) == 1) {
    local_70 = *(uchar **)(lVar10 + 0x60);
    bio_init_dec(bio_00,local_70,*(int *)(lVar10 + 0x7c));
  }
  else if (*(int *)(in_R8 + 0x1440) == 1) {
    local_70 = *(uchar **)(in_R8 + 0x1430);
    bio_init_dec(bio_00,local_70,*(int *)(in_R8 + 0x1448));
  }
  else {
    local_70 = local_48;
    bio_init_dec(bio_00,local_48,(iVar2 + in_EDX) - local_4);
  }
  iVar3 = bio_read(in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
  if (iVar3 == 0) {
    bio_inalign((opj_bio_t *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    iVar4 = bio_numbytes(bio_00);
    local_70 = local_70 + iVar4;
    bio_destroy((opj_bio_t *)0x168521);
    if ((*(uint *)(in_R8 + 4) & 4) != 0) {
      if ((*local_70 == 0xff) && (local_70[1] == 0x92)) {
        local_70 = local_70 + 2;
      }
      else {
        printf("Error : expected EPH marker\n");
      }
    }
    if (in_stack_00000008 != 0) {
      *(long *)(in_stack_00000008 + 8) = (long)(local_4 - iVar2);
    }
    iVar4 = (int)local_70;
    if (*(int *)(lVar10 + 0x70) == 1) {
      *(int *)(lVar10 + 0x7c) =
           *(int *)(lVar10 + 0x7c) + ((int)*(undefined8 *)(lVar10 + 0x60) - iVar4);
      *(uchar **)(lVar10 + 0x60) = local_70;
      local_4 = local_4 - iVar2;
    }
    else if (*(int *)(in_R8 + 0x1440) == 1) {
      *(int *)(in_R8 + 0x1448) =
           *(int *)(in_R8 + 0x1448) + ((int)*(undefined8 *)(in_R8 + 0x1430) - iVar4);
      *(uchar **)(in_R8 + 0x1430) = local_70;
      local_4 = local_4 - iVar2;
    }
    else {
      local_4 = iVar4 - iVar2;
    }
  }
  else {
    for (local_3c = 0; local_3c < *(int *)(lVar6 + 0x18); local_3c = local_3c + 1) {
      piVar7 = (int *)(lVar6 + 0x20 + (long)local_3c * 0x28);
      lVar8 = *(long *)(piVar7 + 6) + (long)iVar4 * 0x30;
      if ((piVar7[2] != *piVar7) && (piVar7[3] != piVar7[1])) {
        for (local_40 = 0; local_40 < *(int *)(lVar8 + 0x10) * *(int *)(lVar8 + 0x14);
            local_40 = local_40 + 1) {
          lVar9 = *(long *)(lVar8 + 0x18) + (long)local_40 * 0x38;
          if (*(int *)(lVar9 + 0x30) == 0) {
            local_ac = tgt_decode(_numimsbs,(opj_tgt_tree_t *)band_2,prc_2._4_4_,(OPJ_INT32)prc_2);
          }
          else {
            local_ac = bio_read(in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
          }
          if (local_ac == 0) {
            *(undefined4 *)(lVar9 + 0x2c) = 0;
          }
          else {
            if (*(int *)(lVar9 + 0x30) == 0) {
              local_c4 = 0;
              while (OVar5 = tgt_decode(_numimsbs,(opj_tgt_tree_t *)band_2,prc_2._4_4_,
                                        (OPJ_INT32)prc_2), OVar5 == 0) {
                local_c4 = local_c4 + 1;
              }
              *(int *)(lVar9 + 0x20) = piVar7[8] - (local_c4 + -1);
              *(undefined4 *)(lVar9 + 0x24) = 3;
            }
            iVar3 = t2_getnumpasses((opj_bio_t *)
                                    CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
            *(int *)(lVar9 + 0x2c) = iVar3;
            iVar3 = t2_getcommacode(in_stack_ffffffffffffff10);
            *(int *)(lVar9 + 0x24) = iVar3 + *(int *)(lVar9 + 0x24);
            local_b8 = 0;
            iVar3 = (int)((ulong)in_stack_ffffffffffffff10 >> 0x20);
            index = (int)((ulong)in_stack_ffffffffffffff18 >> 0x20);
            if (*(int *)(lVar9 + 0x30) == 0) {
              t2_init_seg(in_stack_ffffffffffffff20,index,(int)in_stack_ffffffffffffff18,iVar3);
            }
            else {
              iVar1 = *(int *)(lVar9 + 0x30);
              local_b8 = iVar1 + -1;
              if (*(int *)(*(long *)(lVar9 + 8) + (long)local_b8 * 0x28 + 0xc) ==
                  *(int *)(*(long *)(lVar9 + 8) + (long)local_b8 * 0x28 + 0x18)) {
                t2_init_seg(in_stack_ffffffffffffff20,index,(int)in_stack_ffffffffffffff18,iVar3);
                local_b8 = iVar1;
              }
            }
            local_b4 = *(int *)(lVar9 + 0x2c);
            while( true ) {
              iVar3 = int_min(*(int *)(*(long *)(lVar9 + 8) + (long)local_b8 * 0x28 + 0x18) -
                              *(int *)(*(long *)(lVar9 + 8) + (long)local_b8 * 0x28 + 0xc),local_b4)
              ;
              *(int *)(*(long *)(lVar9 + 8) + (long)local_b8 * 0x28 + 0x1c) = iVar3;
              in_stack_ffffffffffffff0c = *(int *)(lVar9 + 0x24);
              in_stack_ffffffffffffff10 = bio_00;
              int_floorlog2(*(int *)(*(long *)(lVar9 + 8) + (long)local_b8 * 0x28 + 0x1c));
              iVar3 = bio_read(in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
              *(int *)(*(long *)(lVar9 + 8) + (long)local_b8 * 0x28 + 0x20) = iVar3;
              local_b4 = local_b4 - *(int *)(*(long *)(lVar9 + 8) + (long)local_b8 * 0x28 + 0x1c);
              if (local_b4 < 1) break;
              local_b8 = local_b8 + 1;
              t2_init_seg(in_stack_ffffffffffffff20,(int)((ulong)in_stack_ffffffffffffff18 >> 0x20),
                          (int)in_stack_ffffffffffffff18,
                          (int)((ulong)in_stack_ffffffffffffff10 >> 0x20));
            }
          }
        }
      }
    }
    iVar3 = bio_inalign((opj_bio_t *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    if (iVar3 == 0) {
      iVar3 = bio_numbytes(bio_00);
      local_70 = local_70 + iVar3;
      bio_destroy((opj_bio_t *)0x168b15);
      if ((*(uint *)(in_R8 + 4) & 4) != 0) {
        if ((*local_70 != 0xff) || (local_70[1] != 0x92)) {
          opj_event_msg((opj_common_ptr)*in_RDI,1,"Expected EPH marker\n");
          return -999;
        }
        local_70 = local_70 + 2;
      }
      iVar3 = (int)local_70;
      if (in_stack_00000008 != 0) {
        *(long *)(in_stack_00000008 + 8) = (long)(iVar3 - iVar2);
      }
      if (*(int *)(lVar10 + 0x70) == 1) {
        *(int *)(lVar10 + 0x7c) =
             *(int *)(lVar10 + 0x7c) + ((int)*(undefined8 *)(lVar10 + 0x60) - iVar3);
        *(uchar **)(lVar10 + 0x60) = local_70;
      }
      else if (*(int *)(in_R8 + 0x1440) == 1) {
        *(int *)(in_R8 + 0x1448) =
             *(int *)(in_R8 + 0x1448) + ((int)*(undefined8 *)(in_R8 + 0x1430) - iVar3);
        *(uchar **)(in_R8 + 0x1430) = local_70;
      }
      else {
        local_48 = local_70;
      }
      for (local_3c = 0; local_3c < *(int *)(lVar6 + 0x18); local_3c = local_3c + 1) {
        piVar7 = (int *)(lVar6 + 0x20 + (long)local_3c * 0x28);
        lVar10 = *(long *)(piVar7 + 6) + (long)iVar4 * 0x30;
        if ((piVar7[2] != *piVar7) && (piVar7[3] != piVar7[1])) {
          for (local_40 = 0; local_40 < *(int *)(lVar10 + 0x10) * *(int *)(lVar10 + 0x14);
              local_40 = local_40 + 1) {
            plVar11 = (long *)(*(long *)(lVar10 + 0x18) + (long)local_40 * 0x38);
            if (*(int *)((long)plVar11 + 0x2c) != 0) {
              if ((int)plVar11[6] == 0) {
                puVar12 = (undefined8 *)plVar11[1];
                *(int *)(plVar11 + 6) = (int)plVar11[6] + 1;
                *(undefined4 *)(plVar11 + 5) = 0;
              }
              else {
                puVar12 = (undefined8 *)(plVar11[1] + (long)((int)plVar11[6] + -1) * 0x28);
                if (*(int *)((long)puVar12 + 0xc) == *(int *)(puVar12 + 3)) {
                  puVar12 = puVar12 + 5;
                  *(int *)(plVar11 + 6) = (int)plVar11[6] + 1;
                }
              }
              do {
                if (in_RSI + in_EDX < local_48 + *(uint *)(puVar12 + 4)) {
                  return -999;
                }
                pvVar13 = realloc((void *)*plVar11,
                                  (ulong)(uint)((int)plVar11[5] + *(int *)(puVar12 + 4)));
                *plVar11 = (long)pvVar13;
                memcpy((void *)(*plVar11 + (long)(int)plVar11[5]),local_48,
                       (ulong)*(uint *)(puVar12 + 4));
                if (*(int *)((long)puVar12 + 0xc) == 0) {
                  *puVar12 = plVar11;
                  *(int *)(puVar12 + 1) = (int)plVar11[5];
                }
                local_48 = local_48 + *(uint *)(puVar12 + 4);
                *(int *)(plVar11 + 5) = *(int *)(puVar12 + 4) + (int)plVar11[5];
                *(int *)((long)puVar12 + 0x14) =
                     *(int *)(puVar12 + 4) + *(int *)((long)puVar12 + 0x14);
                *(int *)((long)puVar12 + 0xc) =
                     *(int *)((long)puVar12 + 0x1c) + *(int *)((long)puVar12 + 0xc);
                *(int *)((long)plVar11 + 0x2c) =
                     *(int *)((long)plVar11 + 0x2c) - *(int *)((long)puVar12 + 0x1c);
                if (0 < *(int *)((long)plVar11 + 0x2c)) {
                  puVar12 = puVar12 + 5;
                  *(int *)(plVar11 + 6) = (int)plVar11[6] + 1;
                }
              } while (0 < *(int *)((long)plVar11 + 0x2c));
            }
          }
        }
      }
      local_4 = (int)local_48 - iVar2;
    }
    else {
      bio_destroy((opj_bio_t *)0x168ad9);
      local_4 = -999;
    }
  }
  return local_4;
}

Assistant:

static int t2_decode_packet(opj_t2_t* t2, unsigned char *src, int len, opj_tcd_tile_t *tile, 
														opj_tcp_t *tcp, opj_pi_iterator_t *pi, opj_packet_info_t *pack_info) {
	int bandno, cblkno;
	unsigned char *c = src;

	opj_cp_t *cp = t2->cp;

	int compno = pi->compno;	/* component value */
	int resno  = pi->resno;		/* resolution level value */
	int precno = pi->precno;	/* precinct value */
	int layno  = pi->layno;		/* quality layer value */

	opj_tcd_resolution_t* res = &tile->comps[compno].resolutions[resno];

	unsigned char *hd = NULL;
	int present;
	
	opj_bio_t *bio = NULL;	/* BIO component */
	
	if (layno == 0) {
		for (bandno = 0; bandno < res->numbands; bandno++) {
			opj_tcd_band_t *band = &res->bands[bandno];
			opj_tcd_precinct_t *prc = &band->precincts[precno];
			
			if ((band->x1-band->x0 == 0)||(band->y1-band->y0 == 0)) continue;
			
			tgt_reset(prc->incltree);
			tgt_reset(prc->imsbtree);
			for (cblkno = 0; cblkno < prc->cw * prc->ch; cblkno++) {
				opj_tcd_cblk_dec_t* cblk = &prc->cblks.dec[cblkno];
				cblk->numsegs = 0;
			}
		}
	}
	
	/* SOP markers */
	
	if (tcp->csty & J2K_CP_CSTY_SOP) {
		if ((*c) != 0xff || (*(c + 1) != 0x91)) {
			opj_event_msg(t2->cinfo, EVT_WARNING, "Expected SOP marker\n");
		} else {
			c += 6;
		}
		
		/** TODO : check the Nsop value */
	}
	
	/* 
	When the marker PPT/PPM is used the packet header are store in PPT/PPM marker
	This part deal with this caracteristic
	step 1: Read packet header in the saved structure
	step 2: Return to codestream for decoding 
	*/

	bio = bio_create();
	
	if (cp->ppm == 1) {		/* PPM */
		hd = cp->ppm_data;
		bio_init_dec(bio, hd, cp->ppm_len);
	} else if (tcp->ppt == 1) {	/* PPT */
		hd = tcp->ppt_data;
		bio_init_dec(bio, hd, tcp->ppt_len);
	} else {			/* Normal Case */
		hd = c;
		bio_init_dec(bio, hd, src+len-hd);
	}
	
	present = bio_read(bio, 1);
	
	if (!present) {
		bio_inalign(bio);
		hd += bio_numbytes(bio);
		bio_destroy(bio);
		
		/* EPH markers */
		
		if (tcp->csty & J2K_CP_CSTY_EPH) {
			if ((*hd) != 0xff || (*(hd + 1) != 0x92)) {
				printf("Error : expected EPH marker\n");
			} else {
				hd += 2;
			}
		}

		/* << INDEX */
		/* End of packet header position. Currently only represents the distance to start of packet
		// Will be updated later by incrementing with packet start value*/
		if(pack_info) {
			pack_info->end_ph_pos = (int)(c - src);
		}
		/* INDEX >> */
		
		if (cp->ppm == 1) {		/* PPM case */
			cp->ppm_len += cp->ppm_data-hd;
			cp->ppm_data = hd;
			return (c - src);
		}
		if (tcp->ppt == 1) {	/* PPT case */
			tcp->ppt_len+=tcp->ppt_data-hd;
			tcp->ppt_data = hd;
			return (c - src);
		}
		
		return (hd - src);
	}
	
	for (bandno = 0; bandno < res->numbands; bandno++) {
		opj_tcd_band_t *band = &res->bands[bandno];
		opj_tcd_precinct_t *prc = &band->precincts[precno];
		
		if ((band->x1-band->x0 == 0)||(band->y1-band->y0 == 0)) continue;
		
		for (cblkno = 0; cblkno < prc->cw * prc->ch; cblkno++) {
			int included, increment, n, segno;
			opj_tcd_cblk_dec_t* cblk = &prc->cblks.dec[cblkno];
			/* if cblk not yet included before --> inclusion tagtree */
			if (!cblk->numsegs) {
				included = tgt_decode(bio, prc->incltree, cblkno, layno + 1);
				/* else one bit */
			} else {
				included = bio_read(bio, 1);
			}
			/* if cblk not included */
			if (!included) {
				cblk->numnewpasses = 0;
				continue;
			}
			/* if cblk not yet included --> zero-bitplane tagtree */
			if (!cblk->numsegs) {
				int i, numimsbs;
				for (i = 0; !tgt_decode(bio, prc->imsbtree, cblkno, i); i++) {
					;
				}
				numimsbs = i - 1;
				cblk->numbps = band->numbps - numimsbs;
				cblk->numlenbits = 3;
			}
			/* number of coding passes */
			cblk->numnewpasses = t2_getnumpasses(bio);
			increment = t2_getcommacode(bio);
			/* length indicator increment */
			cblk->numlenbits += increment;
			segno = 0;
			if (!cblk->numsegs) {
				t2_init_seg(cblk, segno, tcp->tccps[compno].cblksty, 1);
			} else {
				segno = cblk->numsegs - 1;
				if (cblk->segs[segno].numpasses == cblk->segs[segno].maxpasses) {
					++segno;
					t2_init_seg(cblk, segno, tcp->tccps[compno].cblksty, 0);
				}
			}
			n = cblk->numnewpasses;
			
			do {
				cblk->segs[segno].numnewpasses = int_min(cblk->segs[segno].maxpasses - cblk->segs[segno].numpasses, n);
				cblk->segs[segno].newlen = bio_read(bio, cblk->numlenbits + int_floorlog2(cblk->segs[segno].numnewpasses));
				n -= cblk->segs[segno].numnewpasses;
				if (n > 0) {
					++segno;
					t2_init_seg(cblk, segno, tcp->tccps[compno].cblksty, 0);
				}
			} while (n > 0);
		}
	}
	
	if (bio_inalign(bio)) {
		bio_destroy(bio);
		return -999;
	}
	
	hd += bio_numbytes(bio);
	bio_destroy(bio);
	
	/* EPH markers */
	if (tcp->csty & J2K_CP_CSTY_EPH) {
		if ((*hd) != 0xff || (*(hd + 1) != 0x92)) {
			opj_event_msg(t2->cinfo, EVT_ERROR, "Expected EPH marker\n");
			return -999;
		} else {
			hd += 2;
		}
	}

	/* << INDEX */
	/* End of packet header position. Currently only represents the distance to start of packet
	// Will be updated later by incrementing with packet start value*/
	if(pack_info) {
		pack_info->end_ph_pos = (int)(hd - src);
	}
	/* INDEX >> */
	
	if (cp->ppm==1) {
		cp->ppm_len+=cp->ppm_data-hd;
		cp->ppm_data = hd;
	} else if (tcp->ppt == 1) {
		tcp->ppt_len+=tcp->ppt_data-hd;
		tcp->ppt_data = hd;
	} else {
		c=hd;
	}
	
	for (bandno = 0; bandno < res->numbands; bandno++) {
		opj_tcd_band_t *band = &res->bands[bandno];
		opj_tcd_precinct_t *prc = &band->precincts[precno];
		
		if ((band->x1-band->x0 == 0)||(band->y1-band->y0 == 0)) continue;
		
		for (cblkno = 0; cblkno < prc->cw * prc->ch; cblkno++) {
			opj_tcd_cblk_dec_t* cblk = &prc->cblks.dec[cblkno];
			opj_tcd_seg_t *seg = NULL;
			if (!cblk->numnewpasses)
				continue;
			if (!cblk->numsegs) {
				seg = &cblk->segs[0];
				cblk->numsegs++;
				cblk->len = 0;
			} else {
				seg = &cblk->segs[cblk->numsegs - 1];
				if (seg->numpasses == seg->maxpasses) {
					seg++;
					cblk->numsegs++;
				}
			}
			
			do {
				if (c + seg->newlen > src + len) {
					return -999;
				}

#ifdef USE_JPWL
			/* we need here a j2k handle to verify if making a check to
			the validity of cblocks parameters is selected from user (-W) */

				/* let's check that we are not exceeding */
				if ((cblk->len + seg->newlen) > 8192) {
					opj_event_msg(t2->cinfo, EVT_WARNING,
						"JPWL: segment too long (%d) for codeblock %d (p=%d, b=%d, r=%d, c=%d)\n",
						seg->newlen, cblkno, precno, bandno, resno, compno);
					if (!JPWL_ASSUME) {
						opj_event_msg(t2->cinfo, EVT_ERROR, "JPWL: giving up\n");
						return -999;
					}
					seg->newlen = 8192 - cblk->len;
					opj_event_msg(t2->cinfo, EVT_WARNING, "      - truncating segment to %d\n", seg->newlen);
					break;
				};

#endif /* USE_JPWL */
				
				cblk->data = (unsigned char*) opj_realloc(cblk->data, (cblk->len + seg->newlen) * sizeof(unsigned char));
				memcpy(cblk->data + cblk->len, c, seg->newlen);
				if (seg->numpasses == 0) {
					seg->data = &cblk->data;
					seg->dataindex = cblk->len;
				}
				c += seg->newlen;
				cblk->len += seg->newlen;
				seg->len += seg->newlen;
				seg->numpasses += seg->numnewpasses;
				cblk->numnewpasses -= seg->numnewpasses;
				if (cblk->numnewpasses > 0) {
					seg++;
					cblk->numsegs++;
				}
			} while (cblk->numnewpasses > 0);
		}
	}
	
	return (c - src);
}